

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O3

void si9ma::BinaryTree::iterative_pre_order(TreeNode *head)

{
  _Elt_pointer ppTVar1;
  ostream *poVar2;
  TreeNode *in_RDI;
  stack<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
  s_stack;
  TreeNode *local_80;
  _Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> local_78;
  
  if (in_RDI != (TreeNode *)0x0) {
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_80 = in_RDI;
    std::_Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::
    _M_initialize_map(&local_78,0);
    if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>::
      _M_push_back_aux<si9ma::TreeNode_const*const&>
                ((deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>> *)&local_78,
                 &local_80);
    }
    else {
      *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = in_RDI;
      local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_78._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        ppTVar1 = local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppTVar1 = local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        local_80 = ppTVar1[-1];
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_80->value);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_78._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_78._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_78._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_78._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
          local_78._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
        if (local_80->right != (TreeNode *)0x0) {
          if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>::
            _M_push_back_aux<si9ma::TreeNode_const*const&>
                      ((deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>> *)
                       &local_78,&local_80->right);
          }
          else {
            *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_80->right;
            local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        if (local_80->left != (TreeNode *)0x0) {
          if (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_78._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>::
            _M_push_back_aux<si9ma::TreeNode_const*const&>
                      ((deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>> *)
                       &local_78,&local_80->left);
          }
          else {
            *local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = local_80->left;
            local_78._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_78._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      } while (local_78._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_78._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    std::_Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::
    ~_Deque_base(&local_78);
  }
  return;
}

Assistant:

void BinaryTree::iterative_pre_order(const TreeNode *head) {
        if (head == nullptr)
            return;

        stack<const TreeNode *> s_stack;
        s_stack.push(head);
        while (!s_stack.empty()){
            head = s_stack.top();
            cout << head->value << " ";
            s_stack.pop();

            if (head->right != nullptr)
                s_stack.push(head->right);

            if (head->left != nullptr)
                s_stack.push(head->left);
        }
    }